

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

int Abc_NtkCombinePos(Abc_Ntk_t *pNtk,int fAnd,int fXor)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p0;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x486,"int Abc_NtkCombinePos(Abc_Ntk_t *, int, int)");
  }
  iVar7 = 1;
  if (pNtk->vPos->nSize != 1) {
    pAVar5 = Abc_AigConst1(pNtk);
    p0 = (Abc_Obj_t *)((ulong)pAVar5 ^ 1);
    if (fAnd != 0) {
      p0 = pAVar5;
    }
    pVVar6 = pNtk->vPos;
    uVar3 = pVVar6->nSize;
    if (0 < (int)uVar3) {
      lVar9 = 0;
      do {
        plVar1 = (long *)pVVar6->pArray[lVar9];
        if (fAnd == 0) {
          pAVar5 = (Abc_Obj_t *)
                   ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                   *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8
                             ));
          if (fXor == 0) {
            p0 = Abc_AigOr((Abc_Aig_t *)pNtk->pManFunc,p0,pAVar5);
          }
          else {
            p0 = Abc_AigXor((Abc_Aig_t *)pNtk->pManFunc,p0,pAVar5);
          }
        }
        else {
          p0 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,p0,
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[4] * 8)));
        }
        lVar9 = lVar9 + 1;
        pVVar6 = pNtk->vPos;
        uVar3 = pVVar6->nSize;
      } while (lVar9 < (int)uVar3);
    }
    if (0 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
      do {
        if ((long)pNtk->vPos->nSize < (long)uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Abc_NtkDeleteObj((Abc_Obj_t *)pNtk->vPos->pArray[uVar8 - 1]);
        bVar2 = 1 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    if (pNtk->vPos->nSize != 0) {
      __assert_fail("Abc_NtkPoNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                    ,0x49a,"int Abc_NtkCombinePos(Abc_Ntk_t *, int, int)");
    }
    pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
    Abc_ObjAddFanin(pAVar5,p0);
    Abc_ObjAssignName(pAVar5,"miter",(char *)0x0);
    Abc_NtkOrderCisCos(pNtk);
    iVar4 = Abc_NtkCheck(pNtk);
    if (iVar4 == 0) {
      puts("Abc_NtkOrPos: The network check has failed.");
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Abc_NtkCombinePos( Abc_Ntk_t * pNtk, int fAnd, int fXor )
{
    Abc_Obj_t * pNode, * pMiter;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
//    assert( Abc_NtkLatchNum(pNtk) == 0 );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return 1;
    // start the result
    if ( fAnd )
        pMiter = Abc_AigConst1(pNtk);
    else
        pMiter = Abc_ObjNot( Abc_AigConst1(pNtk) );
    // perform operations on the POs
    Abc_NtkForEachPo( pNtk, pNode, i )
        if ( fAnd )
            pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
        else if ( fXor )
            pMiter = Abc_AigXor( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
        else
            pMiter = Abc_AigOr( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
    // remove the POs and their names
    for ( i = Abc_NtkPoNum(pNtk) - 1; i >= 0; i-- )
        Abc_NtkDeleteObj( Abc_NtkPo(pNtk, i) );
    assert( Abc_NtkPoNum(pNtk) == 0 );
    // create the new PO
    pNode = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pNode, pMiter );
    Abc_ObjAssignName( pNode, "miter", NULL );
    Abc_NtkOrderCisCos( pNtk );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkOrPos: The network check has failed.\n" );
        return 0;
    }
    return 1;
}